

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

ang_file * file_open(char *fname,file_mode mode,file_type ftype)

{
  int __fd;
  ang_file *p;
  FILE *pFVar1;
  char *pcVar2;
  char buf [1024];
  char acStack_428 [1032];
  
  p = (ang_file *)mem_zalloc(0x18);
  my_strcpy(acStack_428,fname,0x400);
  if (mode == MODE_APPEND) {
    pcVar2 = "a+";
  }
  else if (mode == MODE_READ) {
    pcVar2 = "rb";
  }
  else {
    if (mode != MODE_WRITE) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-file.c"
                    ,0x40d,"ang_file *file_open(const char *, file_mode, file_type)");
    }
    if (ftype == FTYPE_SAVE) {
      pFVar1 = (FILE *)0x0;
      __fd = open(acStack_428,0xc1,0x180);
      if (-1 < __fd) {
        pFVar1 = fdopen(__fd,"wb");
      }
      goto LAB_00212434;
    }
    pcVar2 = "wb";
  }
  pFVar1 = fopen(acStack_428,pcVar2);
LAB_00212434:
  p->fh = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    mem_free(p);
    p = (ang_file *)0x0;
  }
  else {
    pcVar2 = string_make(acStack_428);
    p->fname = pcVar2;
    p->mode = mode;
    if (file_open_hook != (_func_void_char_ptr_file_type *)0x0 && mode != MODE_READ) {
      (*file_open_hook)(acStack_428,ftype);
    }
  }
  return p;
}

Assistant:

ang_file *file_open(const char *fname, file_mode mode, file_type ftype)
{
	ang_file *f = mem_zalloc(sizeof(ang_file));
	char buf[1024];

	(void)ftype;

	/* Get the system-specific path */
	path_parse(buf, sizeof(buf), fname);

	switch (mode) {
		case MODE_WRITE: { 
			if (ftype == FTYPE_SAVE) {
				/* open only if the file does not exist */
				int fd;
				fd = open(buf, O_CREAT | O_EXCL | O_WRONLY | O_BINARY, S_IRUSR | S_IWUSR);
				if (fd < 0) {
					/* there was some error */
					f->fh = NULL;
				} else {
					f->fh = fdopen(fd, "wb");
				}
			} else {
				f->fh = fopen(buf, "wb");
			}
			break;
		}
		case MODE_READ:
			f->fh = fopen(buf, "rb");
			break;
		case MODE_APPEND:
			f->fh = fopen(buf, "a+");
			break;
		default:
			assert(0);
	}

	if (f->fh == NULL) {
		mem_free(f);
		return NULL;
	}

	f->fname = string_make(buf);
	f->mode = mode;

	if (mode != MODE_READ && file_open_hook)
		file_open_hook(buf, ftype);

	return f;
}